

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::RollbackUpdate<unsigned_int>(UpdateInfo *base_info,UpdateInfo *rollback_info)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (rollback_info->N != 0) {
    uVar1 = base_info->max;
    uVar2 = rollback_info->max;
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar4 = lVar4 + -1;
      do {
        lVar3 = lVar4;
        lVar4 = lVar3 + 1;
      } while (*(uint *)((long)&base_info[1].segment + lVar3 * 4 + 4) <
               *(uint *)((long)&rollback_info[1].segment + uVar5 * 4));
      *(undefined4 *)((long)&base_info[1].segment + lVar3 * 4 + 4 + (ulong)uVar1 * 4) =
           *(undefined4 *)((long)&rollback_info[1].segment + uVar5 * 4 + (ulong)uVar2 * 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 < rollback_info->N);
  }
  return;
}

Assistant:

static void RollbackUpdate(UpdateInfo &base_info, UpdateInfo &rollback_info) {
	auto base_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	auto rollback_data = rollback_info.GetData<T>();
	auto rollback_tuples = rollback_info.GetTuples();
	idx_t base_offset = 0;
	for (idx_t i = 0; i < rollback_info.N; i++) {
		auto id = rollback_tuples[i];
		while (base_tuples[base_offset] < id) {
			base_offset++;
			D_ASSERT(base_offset < base_info.N);
		}
		base_data[base_offset] = rollback_data[i];
	}
}